

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O1

void __thiscall SpriteBase::create(SpriteBase *this,size_t w,size_t h)

{
  uint8_t *puVar1;
  
  if (this->data != (uint8_t *)0x0) {
    operator_delete__(this->data);
    this->data = (uint8_t *)0x0;
  }
  this->width = w;
  this->height = h;
  puVar1 = (uint8_t *)operator_new__(w * h * 4);
  this->data = puVar1;
  return;
}

Assistant:

void
SpriteBase::create(size_t w, size_t h) {
  if (data != nullptr) {
    delete[] data;
    data = nullptr;
  }

  width = w;
  height = h;
  data =  new uint8_t[width * height * 4];
}